

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::GenDartTypeName
          (string *__return_storage_ptr__,DartGenerator *this,Type *type,
          Namespace *current_namespace,FieldDef *def,bool nullable,string *struct_type_suffix)

{
  bool bVar1;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)struct_type_suffix);
  GenDartTypeName(__return_storage_ptr__,this,type,current_namespace,def,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (nullable) {
    bVar1 = std::operator!=(__return_storage_ptr__,"dynamic");
    if (bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDartTypeName(const Type &type, Namespace *current_namespace,
                              const FieldDef &def, bool nullable,
                              std::string struct_type_suffix) {
    std::string typeName =
        GenDartTypeName(type, current_namespace, def, struct_type_suffix);
    if (nullable && typeName != "dynamic") typeName += "?";
    return typeName;
  }